

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutPre22.c
# Opt level: O1

void Cut_CellDumpToFile(void)

{
  Cut_CMan_t *pCVar1;
  int iVar2;
  FILE *__stream;
  Cut_Cell_t *pCVar3;
  long lVar4;
  int *piVar5;
  uint uVar6;
  ulong uVar7;
  int level;
  char *__s;
  long lVar8;
  int *__s_00;
  int *__s_01;
  ulong uVar9;
  bool bVar10;
  timespec ts;
  int NumUsed [10] [5];
  int BoxUsed [22] [5];
  int aiStack_be8 [580];
  timespec local_2d8;
  Cut_CMan_t *local_2c8;
  long local_2c0;
  int local_2b8 [52];
  int local_1e8 [110];
  
  pCVar1 = s_pCMan;
  __s_01 = local_2b8;
  memset(__s_01,0,200);
  __s_00 = local_1e8;
  memset(__s_00,0,0x1b8);
  iVar2 = clock_gettime(3,&local_2d8);
  if (iVar2 < 0) {
    lVar4 = 1;
  }
  else {
    lVar4 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_2d8.tv_nsec),8);
    lVar4 = ((lVar4 >> 7) - (lVar4 >> 0x3f)) + local_2d8.tv_sec * -1000000;
  }
  if (pCVar1 == (Cut_CMan_t *)0x0) {
    __s = "Cut_CellDumpToFile: Cell manager is not defined.";
  }
  else {
    local_2c0 = lVar4;
    lVar4 = 9;
    do {
      pCVar3 = pCVar1->pSameVar[lVar4];
      if (pCVar3 != (Cut_Cell_t *)0x0) {
        do {
          iVar2 = pCVar3->nUsed;
          piVar5 = local_2b8 + lVar4 * 5;
          if ((((iVar2 != 0) && (piVar5 = local_2b8 + lVar4 * 5 + 1, 9 < iVar2)) &&
              (piVar5 = local_2b8 + lVar4 * 5 + 2, 99 < iVar2)) &&
             (piVar5 = local_2b8 + lVar4 * 5 + 4, iVar2 < 1000)) {
            piVar5 = local_2b8 + lVar4 * 5 + 3;
          }
          *piVar5 = *piVar5 + 1;
          lVar8 = 0;
          do {
            if (iVar2 == 0) {
              piVar5 = local_1e8 + (long)pCVar3->Box[lVar8] * 5;
            }
            else if (iVar2 < 10) {
              piVar5 = local_1e8 + (long)pCVar3->Box[lVar8] * 5 + 1;
            }
            else if (iVar2 < 100) {
              piVar5 = local_1e8 + (long)pCVar3->Box[lVar8] * 5 + 2;
            }
            else if (iVar2 < 1000) {
              piVar5 = local_1e8 + (long)pCVar3->Box[lVar8] * 5 + 3;
            }
            else {
              piVar5 = local_1e8 + (long)pCVar3->Box[lVar8] * 5 + 4;
            }
            *piVar5 = *piVar5 + 1;
            lVar8 = lVar8 + 1;
          } while (lVar8 != 4);
          pCVar3 = pCVar3->pNextVar;
        } while (pCVar3 != (Cut_Cell_t *)0x0);
      }
      bVar10 = lVar4 != 0;
      lVar4 = lVar4 + -1;
    } while (bVar10);
    local_2c8 = pCVar1;
    printf("Functions found = %10d.  Functions not found = %10d.\n",(ulong)(uint)pCVar1->nCellFound,
           (ulong)(uint)pCVar1->nCellNotFound);
    uVar7 = 0;
    do {
      printf("%3d  : ",uVar7 & 0xffffffff);
      lVar4 = 0;
      do {
        printf("%8d ",(ulong)(uint)__s_01[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      putchar(10);
      uVar7 = uVar7 + 1;
      __s_01 = __s_01 + 5;
    } while (uVar7 != 10);
    puts("Box usage:");
    uVar7 = 0;
    do {
      printf("%3d  : ",uVar7 & 0xffffffff);
      lVar4 = 0;
      do {
        printf("%8d ",(ulong)(uint)__s_00[lVar4]);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 5);
      printf("  %s",(long)&s_NP3Names_rel + (long)(int)(&s_NP3Names_rel)[uVar7]);
      putchar(10);
      uVar7 = uVar7 + 1;
      __s_00 = __s_00 + 5;
    } while (uVar7 != 0x16);
    __stream = fopen("celllib22.txt","w");
    pCVar1 = local_2c8;
    if (__stream != (FILE *)0x0) {
      uVar7 = 0;
      uVar6 = 0;
      do {
        pCVar3 = pCVar1->pSameVar[uVar7];
        if (pCVar3 != (Cut_Cell_t *)0x0) {
          uVar9 = 5;
          if (5 < (uint)uVar7) {
            uVar9 = uVar7 & 0xffffffff;
          }
          do {
            if (0 < pCVar3->nUsed) {
              Extra_PrintHexadecimal((FILE *)__stream,pCVar3->uTruth,(int)uVar9);
              fputc(10,__stream);
              uVar6 = uVar6 + 1;
            }
            pCVar3 = pCVar3->pNextVar;
          } while (pCVar3 != (Cut_Cell_t *)0x0);
        }
        fputc(10,__stream);
        uVar7 = uVar7 + 1;
      } while (uVar7 != 10);
      fclose(__stream);
      iVar2 = 0x874418;
      printf("Library composed of %d functions is written into file \"%s\".  ",(ulong)uVar6,
             "celllib22.txt");
      Abc_Print(iVar2,"%s =","Time");
      level = 3;
      iVar2 = clock_gettime(3,&local_2d8);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_2d8.tv_nsec / 1000 + local_2d8.tv_sec * 1000000;
      }
      Abc_Print(level,"%9.2f sec\n",(double)(lVar4 + local_2c0) / 1000000.0);
      return;
    }
    __s = "Cut_CellDumpToFile: Cannout open output file.";
  }
  puts(__s);
  return;
}

Assistant:

void Cut_CellDumpToFile()
{
    FILE * pFile;
    Cut_CMan_t * p = s_pCMan;
    Cut_Cell_t * pTemp;
    char * pFileName = "celllib22.txt";
    int NumUsed[10][5] = {{0}};
    int BoxUsed[22][5] = {{0}};
    int i, k, Counter;
    abctime clk = Abc_Clock();

    if ( p == NULL )
    {
        printf( "Cut_CellDumpToFile: Cell manager is not defined.\n" );
        return;
    }

    // count the number of cells used
    for ( k = CUT_CELL_MVAR; k >= 0; k-- )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
        {
            if ( pTemp->nUsed == 0 )
                NumUsed[k][0]++;
            else if ( pTemp->nUsed < 10 )
                NumUsed[k][1]++;
            else if ( pTemp->nUsed < 100 )
                NumUsed[k][2]++;
            else if ( pTemp->nUsed < 1000 )
                NumUsed[k][3]++;
            else 
                NumUsed[k][4]++;

            for ( i = 0; i < 4; i++ )
                if ( pTemp->nUsed == 0 )
                    BoxUsed[ (int)pTemp->Box[i] ][0]++;
                else if ( pTemp->nUsed < 10 )
                    BoxUsed[ (int)pTemp->Box[i] ][1]++;
                else if ( pTemp->nUsed < 100 )
                    BoxUsed[ (int)pTemp->Box[i] ][2]++;
                else if ( pTemp->nUsed < 1000 )
                    BoxUsed[ (int)pTemp->Box[i] ][3]++;
                else 
                    BoxUsed[ (int)pTemp->Box[i] ][4]++;
        }
    }

    printf( "Functions found = %10d.  Functions not found = %10d.\n", p->nCellFound, p->nCellNotFound );
    for ( k = 0; k <= CUT_CELL_MVAR; k++ )
    {
        printf( "%3d  : ", k );
        for ( i = 0; i < 5; i++ ) 
            printf( "%8d ", NumUsed[k][i] );
        printf( "\n" );
    }
    printf( "Box usage:\n" );
    for ( k = 0; k < 22; k++ )
    {
        printf( "%3d  : ", k );
        for ( i = 0; i < 5; i++ ) 
            printf( "%8d ", BoxUsed[k][i] );
        printf( "  %s", s_NP3Names[k] );
        printf( "\n" );
    }

    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        printf( "Cut_CellDumpToFile: Cannout open output file.\n" );
        return;
    }

    Counter = 0;
    for ( k = 0; k <= CUT_CELL_MVAR; k++ )
    {
        for ( pTemp = p->pSameVar[k]; pTemp; pTemp = pTemp->pNextVar )
            if ( pTemp->nUsed > 0 )
            {
                Extra_PrintHexadecimal( pFile, pTemp->uTruth, (k <= 5? 5 : k) );
                fprintf( pFile, "\n" );
                Counter++;
            }
        fprintf( pFile, "\n" );
    }
    fclose( pFile );

    printf( "Library composed of %d functions is written into file \"%s\".  ", Counter, pFileName );

    ABC_PRT( "Time", Abc_Clock() - clk );
}